

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_rtr_32(void)

{
  uint value;
  
  value = m68ki_pull_16();
  m68ki_set_ccr(value);
  m68ki_cpu.pc = m68ki_pull_32();
  return;
}

Assistant:

static void m68k_op_rtr_32(void)
{
	m68ki_trace_t0();				   /* auto-disable (see m68kcpu.h) */
	m68ki_set_ccr(m68ki_pull_16());
	m68ki_jump(m68ki_pull_32());
}